

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O1

vector_type * __thiscall
Disa::Vector_Dense<double,0ul>::operator-=
          (Vector_Dense<double,0ul> *this,Vector_Dense<double,_3UL> *vector)

{
  long lVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type index;
  source_location *location;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *local_100;
  size_type local_f8;
  size_type local_f0;
  undefined8 uStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  lVar1 = *(long *)this;
  location = (source_location *)(*(long *)(this + 8) - lVar1);
  if (location == (source_location *)0x18) {
    lVar4 = 0;
    do {
      *(double *)(lVar1 + lVar4 * 8) =
           *(double *)(lVar1 + lVar4 * 8) - (vector->super_array<double,_3UL>)._M_elems[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    return (vector_type *)this;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_40 = &PTR_s__workspace_llm4binary_github_lic_00162718;
  console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__cxx11::to_string(&local_a0,*(long *)(this + 8) - *(long *)this >> 3);
  std::operator+(&local_80,"Incompatible vector sizes, ",&local_a0);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_80," vs. ");
  local_e0._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p == paVar5) {
    local_e0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_e0._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_c0,3);
  std::operator+(&local_60,&local_e0,&local_c0);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_60,".");
  local_100 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100 == paVar5) {
    local_f0 = paVar5->_M_allocated_capacity;
    uStack_e8 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_100 = &local_f0;
  }
  else {
    local_f0 = paVar5->_M_allocated_capacity;
  }
  local_f8 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_100,local_f8);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_38);
  exit(1);
}

Assistant:

constexpr vector_type& operator-=(const Vector_Dense<_type, _size_other>& vector) {
    ASSERT_DEBUG(this->size() == vector.size(), "Incompatible vector sizes, " + std::to_string(this->size()) + " vs. " +
                                                std::to_string(vector.size()) + ".");
    FOR(index, this->size())(*this)[index] -= vector[index];
    return *this;
  }